

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

Matrix44<float> * __thiscall
Imath_3_2::Matrix44<float>::inverse
          (Matrix44<float> *__return_storage_ptr__,Matrix44<float> *this,bool singExc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  float (*pafVar6) [4];
  invalid_argument *this_00;
  int i;
  long lVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar13;
  undefined1 auVar12 [16];
  float fVar14;
  float fVar15;
  float fVar16;
  Matrix44<float> local_50;
  
  if ((((this->x[0][3] != 0.0) || (fVar14 = this->x[1][3], fVar14 != 0.0)) || (NAN(fVar14))) ||
     (((fVar14 = this->x[2][3], fVar14 != 0.0 || (NAN(fVar14))) ||
      ((fVar14 = this->x[3][3], fVar14 != 1.0 || (NAN(fVar14))))))) {
    gjInverse(__return_storage_ptr__,this,singExc);
  }
  else {
    fVar14 = this->x[1][1];
    fVar10 = this->x[1][2];
    fVar11 = this->x[0][2];
    fVar1 = this->x[0][0];
    fVar2 = this->x[0][1];
    fVar3 = this->x[2][0];
    fVar4 = this->x[1][0];
    uVar5 = *(undefined8 *)(this->x[2] + 1);
    fVar15 = (float)uVar5;
    fVar16 = (float)((ulong)uVar5 >> 0x20);
    local_50.x[0][0] = fVar14 * fVar16 - fVar10 * fVar15;
    local_50.x[1][0] = fVar3 * fVar10 - fVar16 * fVar4;
    local_50.x[0][1] = fVar11 * fVar15 - fVar16 * fVar2;
    local_50.x[0][2] = fVar2 * fVar10 - fVar11 * fVar14;
    local_50.x[0][3] = 0.0;
    local_50.x[1][1] = fVar16 * fVar1 - fVar11 * fVar3;
    local_50.x[1][2] = fVar11 * fVar4 - fVar10 * fVar1;
    local_50.x[1][3] = 0.0;
    fVar9 = fVar4 * fVar15 - fVar14 * fVar3;
    fVar13 = fVar3 * fVar2 - fVar15 * fVar1;
    local_50.x[2][0] = fVar9;
    local_50.x[2][1] = fVar13;
    local_50.x[2][2] = fVar1 * fVar14 - fVar2 * fVar4;
    local_50.x[2][3] = 0.0;
    local_50.x[3][0] = 0.0;
    local_50.x[3][1] = 0.0;
    local_50.x[3][2] = 0.0;
    local_50.x[3][3] = 1.0;
    fVar10 = fVar9 * fVar11 + local_50.x[0][0] * fVar1 + local_50.x[1][0] * fVar2;
    fVar14 = fVar10;
    if (fVar10 <= -fVar10) {
      fVar14 = -fVar10;
    }
    if (1.0 <= fVar14) {
      pafVar6 = (float (*) [4])&local_50;
      for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
        for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
          (*(float (*) [4])*pafVar6)[lVar8] = (*(float (*) [4])*pafVar6)[lVar8] / fVar10;
        }
        pafVar6 = pafVar6 + 1;
      }
    }
    else {
      pafVar6 = (float (*) [4])&local_50;
      for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
        for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
          fVar11 = (*(float (*) [4])*pafVar6)[lVar8];
          fVar1 = fVar11;
          if (fVar11 <= -fVar11) {
            fVar1 = -fVar11;
          }
          if (fVar14 * 8.507059e+37 <= fVar1) {
            if (!singExc) {
              __return_storage_ptr__->x[0][0] = 1.0;
              auVar12._0_12_ = ZEXT812(0);
              auVar12._12_4_ = 0;
              *(undefined1 (*) [16])(__return_storage_ptr__->x[0] + 1) = auVar12;
              __return_storage_ptr__->x[1][1] = 1.0;
              *(undefined1 (*) [16])(__return_storage_ptr__->x[1] + 2) = auVar12;
              __return_storage_ptr__->x[2][2] = 1.0;
              *(undefined1 (*) [16])(__return_storage_ptr__->x[2] + 3) = auVar12;
              __return_storage_ptr__->x[3][3] = 1.0;
              return __return_storage_ptr__;
            }
            this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument(this_00,"Cannot invert singular matrix.");
            __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          (*(float (*) [4])*pafVar6)[lVar8] = fVar11 / fVar10;
        }
        pafVar6 = pafVar6 + 1;
      }
    }
    fVar11 = (float)((uint)this->x[3][0] ^ (uint)DAT_00153290);
    fVar14 = this->x[3][1];
    fVar10 = this->x[3][2];
    local_50.x[3][0] =
         (fVar11 * local_50.x[0][0] - local_50.x[1][0] * fVar14) - fVar10 * local_50.x[2][0];
    local_50.x[3][1] =
         (fVar11 * local_50.x[0][1] - local_50.x[1][1] * fVar14) - fVar10 * local_50.x[2][1];
    local_50.x[3][2] =
         (local_50.x[0][2] * fVar11 - fVar14 * local_50.x[1][2]) - fVar10 * local_50.x[2][2];
    Matrix44(__return_storage_ptr__,&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

IMATH_CONSTEXPR14 inline Matrix44<T>
Matrix44<T>::inverse (bool singExc) const
{
    if (x[0][3] != 0 || x[1][3] != 0 || x[2][3] != 0 || x[3][3] != 1)
        return gjInverse (singExc);

    Matrix44 s (
        x[1][1] * x[2][2] - x[2][1] * x[1][2],
        x[2][1] * x[0][2] - x[0][1] * x[2][2],
        x[0][1] * x[1][2] - x[1][1] * x[0][2],
        0,

        x[2][0] * x[1][2] - x[1][0] * x[2][2],
        x[0][0] * x[2][2] - x[2][0] * x[0][2],
        x[1][0] * x[0][2] - x[0][0] * x[1][2],
        0,

        x[1][0] * x[2][1] - x[2][0] * x[1][1],
        x[2][0] * x[0][1] - x[0][0] * x[2][1],
        x[0][0] * x[1][1] - x[1][0] * x[0][1],
        0,

        0,
        0,
        0,
        1);

    T r = x[0][0] * s.x[0][0] + x[0][1] * s.x[1][0] + x[0][2] * s.x[2][0];

    if (IMATH_INTERNAL_NAMESPACE::abs (r) >= 1)
    {
        for (int i = 0; i < 3; ++i)
        {
            for (int j = 0; j < 3; ++j)
            {
                s.x[i][j] /= r;
            }
        }
    }
    else
    {
        T mr =
            IMATH_INTERNAL_NAMESPACE::abs (r) / std::numeric_limits<T>::min ();

        for (int i = 0; i < 3; ++i)
        {
            for (int j = 0; j < 3; ++j)
            {
                if (mr > IMATH_INTERNAL_NAMESPACE::abs (s.x[i][j]))
                {
                    s.x[i][j] /= r;
                }
                else
                {
                    if (singExc)
                        throw std::invalid_argument (
                            "Cannot invert singular matrix.");

                    return Matrix44 ();
                }
            }
        }
    }

    s.x[3][0] =
        -x[3][0] * s.x[0][0] - x[3][1] * s.x[1][0] - x[3][2] * s.x[2][0];
    s.x[3][1] =
        -x[3][0] * s.x[0][1] - x[3][1] * s.x[1][1] - x[3][2] * s.x[2][1];
    s.x[3][2] =
        -x[3][0] * s.x[0][2] - x[3][1] * s.x[1][2] - x[3][2] * s.x[2][2];

    return s;
}